

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O0

void Abc_NtkDumpVariableOrder(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  FILE *__stream;
  int local_24;
  int i;
  FILE *pFile;
  DdManager *dd;
  Abc_Ntk_t *pNtk_local;
  
  pvVar1 = Abc_NtkGlobalBddMan(pNtk);
  __stream = fopen("order.txt","wb");
  for (local_24 = 0; local_24 < *(int *)((long)pvVar1 + 0x88); local_24 = local_24 + 1) {
    fprintf(__stream,"%d ",(ulong)*(uint *)(*(long *)((long)pvVar1 + 0x148) + (long)local_24 * 4));
  }
  fprintf(__stream,"\n");
  fclose(__stream);
  return;
}

Assistant:

void Abc_NtkDumpVariableOrder( Abc_Ntk_t * pNtk )
{
    DdManager * dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );
    FILE * pFile = fopen( "order.txt", "wb" ); int i;
    for ( i = 0; i < dd->size; i++ )
        fprintf( pFile, "%d ", dd->invperm[i] );
    fprintf( pFile, "\n" );
    fclose( pFile );
}